

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O3

Vector __thiscall Vector::operator/(Vector *this,float f)

{
  float fVar1;
  Vector VVar2;
  
  fVar1 = 1.0 / f;
  VVar2.m_vec[0] = fVar1 * (float)*(undefined8 *)this->m_vec;
  VVar2.m_vec[1] = fVar1 * (float)((ulong)*(undefined8 *)this->m_vec >> 0x20);
  VVar2.m_length = -1.0;
  VVar2.m_vec[2] = fVar1 * this->m_vec[2];
  return VVar2;
}

Assistant:

Vector Vector::operator/ (float f)
{
   Vector vec(X(), Y(), Z());

   vec.Scale(1.f / f);

   return vec;
}